

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_slab.c
# Opt level: O0

ngx_slab_page_t * ngx_slab_alloc_pages(ngx_slab_pool_t *pool,ngx_uint_t pages)

{
  ngx_slab_page_t *pnVar1;
  ngx_slab_page_t *local_30;
  ngx_slab_page_t *p;
  ngx_slab_page_t *page;
  ngx_uint_t pages_local;
  ngx_slab_pool_t *pool_local;
  
  p = (pool->free).next;
  while( true ) {
    if (p == &pool->free) {
      if ((pool->field_0x79 & 1) != 0) {
        ngx_slab_error(pool,3,"ngx_slab_alloc() failed: no memory");
      }
      return (ngx_slab_page_t *)0x0;
    }
    if (pages <= p->slab) break;
    p = p->next;
  }
  if (pages < p->slab) {
    p[p->slab - 1].prev = (uintptr_t)(p + pages);
    p[pages].slab = p->slab - pages;
    p[pages].next = p->next;
    p[pages].prev = p->prev;
    *(ngx_slab_page_t **)(p->prev + 8) = p + pages;
    p->next->prev = (uintptr_t)(p + pages);
  }
  else {
    *(ngx_slab_page_t **)(p->prev + 8) = p->next;
    p->next->prev = p->prev;
  }
  p->slab = pages | 0x8000000000000000;
  p->next = (ngx_slab_page_t *)0x0;
  p->prev = 0;
  pool->pfree = pool->pfree - pages;
  page = (ngx_slab_page_t *)(pages - 1);
  pnVar1 = p;
  if (page == (ngx_slab_page_t *)0x0) {
    return p;
  }
  for (; local_30 = pnVar1 + 1, page != (ngx_slab_page_t *)0x0;
      page = (ngx_slab_page_t *)((long)&page[-1].prev + 7)) {
    local_30->slab = 0xffffffffffffffff;
    pnVar1[1].next = (ngx_slab_page_t *)0x0;
    pnVar1[1].prev = 0;
    pnVar1 = local_30;
  }
  return p;
}

Assistant:

static ngx_slab_page_t *
ngx_slab_alloc_pages(ngx_slab_pool_t *pool, ngx_uint_t pages)
{
    ngx_slab_page_t  *page, *p;

    for (page = pool->free.next; page != &pool->free; page = page->next) {

        if (page->slab >= pages) {

            if (page->slab > pages) {
                page[page->slab - 1].prev = (uintptr_t) &page[pages];

                page[pages].slab = page->slab - pages;
                page[pages].next = page->next;
                page[pages].prev = page->prev;

                p = (ngx_slab_page_t *) page->prev;
                p->next = &page[pages];
                page->next->prev = (uintptr_t) &page[pages];

            } else {
                p = (ngx_slab_page_t *) page->prev;
                p->next = page->next;
                page->next->prev = page->prev;
            }

            page->slab = pages | NGX_SLAB_PAGE_START;
            page->next = NULL;
            page->prev = NGX_SLAB_PAGE;

            pool->pfree -= pages;

            if (--pages == 0) {
                return page;
            }

            for (p = page + 1; pages; pages--) {
                p->slab = NGX_SLAB_PAGE_BUSY;
                p->next = NULL;
                p->prev = NGX_SLAB_PAGE;
                p++;
            }

            return page;
        }
    }

    if (pool->log_nomem) {
        ngx_slab_error(pool, NGX_LOG_CRIT,
                       "ngx_slab_alloc() failed: no memory");
    }

    return NULL;
}